

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cpp
# Opt level: O2

MeshGL * CubeSTL(void)

{
  vector<float,_std::allocator<float>_> *this;
  int iVar1;
  uint uVar2;
  undefined4 uVar3;
  ulong uVar4;
  long lVar5;
  vec<double,_3> *a;
  long lVar6;
  long lVar7;
  ulong uVar8;
  MeshGL *in_RDI;
  long lVar9;
  int iVar10;
  float local_1d8;
  int local_1d4 [3];
  double local_1c8;
  double dStack_1c0;
  double local_1b8;
  MeshGL *local_1b0;
  mat3 triPos;
  vec3 normal;
  MeshGL cubeIn;
  
  manifold::Manifold::Cube(&triPos,1);
  manifold::Manifold::GetMeshGL((int)&cubeIn);
  manifold::Manifold::~Manifold((Manifold *)&triPos);
  this = &in_RDI->vertProperties;
  memset(this,0,0xdc);
  in_RDI->numProp = 6;
  iVar10 = 0;
  uVar8 = 0;
  local_1b0 = in_RDI;
  while( true ) {
    uVar4 = (long)cubeIn.triVerts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)cubeIn.triVerts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 2;
    a = (vec<double,_3> *)(uVar4 % 3);
    if ((uVar4 / 3 & 0xffffffff) <= uVar8) break;
    triPos.z.x = 0.0;
    triPos.z.y = 0.0;
    triPos.y.y = 0.0;
    triPos.y.z = 0.0;
    triPos.x.z = 0.0;
    triPos.y.x = 0.0;
    triPos.x.x = 0.0;
    triPos.x.y = 0.0;
    triPos.z.z = 0.0;
    normal.x = 2.12199579096527e-314;
    normal.y._0_4_ = 2;
    for (lVar7 = 0; lVar7 != 0xc; lVar7 = lVar7 + 4) {
      iVar1 = *(int *)((long)&normal.x + lVar7);
      local_1c8 = (double)CONCAT44(local_1c8._4_4_,iVar10);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&in_RDI->triVerts,(uint *)&local_1c8);
      iVar10 = iVar10 + 1;
      local_1c8 = 2.12199579096527e-314;
      dStack_1c0 = (double)CONCAT44(dStack_1c0._4_4_,2);
      uVar2 = cubeIn.triVerts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 3 + (long)iVar1];
      lVar6 = 0x30;
      if (iVar1 == 1) {
        lVar6 = 0x18;
      }
      if (iVar1 == 0) {
        lVar6 = 0;
      }
      a = (vec<double,_3> *)((long)&triPos.x.x + lVar6);
      for (lVar6 = 0; lVar6 != 0xc; lVar6 = lVar6 + 4) {
        iVar1 = *(int *)((long)&local_1c8 + lVar6);
        lVar9 = 0;
        if (iVar1 != 0) {
          lVar9 = (ulong)(iVar1 != 1) * 8 + 8;
        }
        *(double *)((long)&a->x + lVar9) =
             (double)cubeIn.vertProperties.super__Vector_base<float,_std::allocator<float>_>._M_impl
                     .super__Vector_impl_data._M_start[uVar2 * cubeIn.numProp + iVar1];
      }
    }
    local_1c8 = (triPos.y.y - triPos.x.y) * (triPos.z.z - triPos.x.z) -
                (triPos.z.y - triPos.x.y) * (triPos.y.z - triPos.x.z);
    dStack_1c0 = (triPos.y.z - triPos.x.z) * (triPos.z.x - triPos.x.x) -
                 (triPos.z.z - triPos.x.z) * (triPos.y.x - triPos.x.x);
    local_1b8 = (triPos.y.x - triPos.x.x) * (triPos.z.y - triPos.x.y) -
                (triPos.z.x - triPos.x.x) * (triPos.y.y - triPos.x.y);
    linalg::normalize<double,3>(&normal,(linalg *)&local_1c8,a);
    local_1c8 = 2.12199579096527e-314;
    dStack_1c0 = (double)CONCAT44(dStack_1c0._4_4_,2);
    for (lVar7 = 0; lVar7 != 0xc; lVar7 = lVar7 + 4) {
      local_1d4[0] = 0;
      local_1d4[1] = 1;
      local_1d4[2] = 2;
      lVar6 = 0x30;
      if (*(int *)((long)&local_1c8 + lVar7) == 1) {
        lVar6 = 0x18;
      }
      if (*(int *)((long)&local_1c8 + lVar7) == 0) {
        lVar6 = 0;
      }
      for (lVar9 = 0; lVar9 != 0xc; lVar9 = lVar9 + 4) {
        lVar5 = 0;
        if (*(int *)((long)local_1d4 + lVar9) != 0) {
          lVar5 = (ulong)(*(int *)((long)local_1d4 + lVar9) != 1) * 8 + 8;
        }
        local_1d8 = (float)*(double *)((long)&triPos.x.x + lVar5 + lVar6);
        std::vector<float,_std::allocator<float>_>::emplace_back<float>(this,&local_1d8);
      }
      local_1d4[0] = 0;
      local_1d4[1] = 1;
      local_1d4[2] = 2;
      for (lVar6 = 0; lVar6 != 0xc; lVar6 = lVar6 + 4) {
        lVar9 = 0;
        if (*(int *)((long)local_1d4 + lVar6) != 0) {
          lVar9 = (ulong)(*(int *)((long)local_1d4 + lVar6) != 1) * 8 + 8;
        }
        local_1d8 = (float)*(double *)((long)&normal.x + lVar9);
        std::vector<float,_std::allocator<float>_>::emplace_back<float>(this,&local_1d8);
      }
    }
    uVar8 = uVar8 + 1;
  }
  uVar3 = manifold::Manifold::ReserveIDs(1);
  triPos.x.x = (double)CONCAT44(triPos.x.x._4_4_,uVar3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&local_1b0->runOriginalID,(uint *)&triPos);
  manifold::MeshGLP<float,_unsigned_int>::~MeshGLP(&cubeIn);
  return local_1b0;
}

Assistant:

MeshGL CubeSTL() {
  const MeshGL cubeIn = Manifold::Cube(vec3(1), true).GetMeshGL();
  MeshGL cube;
  cube.numProp = 6;

  for (size_t tri = 0, vert = 0; tri < cubeIn.NumTri(); tri++) {
    mat3 triPos;
    for (const int i : {0, 1, 2}) {
      cube.triVerts.push_back(vert++);

      for (const int j : {0, 1, 2}) {
        triPos[i][j] =
            cubeIn
                .vertProperties[cubeIn.numProp * cubeIn.triVerts[3 * tri + i] +
                                j];
      }
    }

    const vec3 normal =
        la::normalize(la::cross(triPos[1] - triPos[0], triPos[2] - triPos[0]));
    for (const int i : {0, 1, 2}) {
      for (const int j : {0, 1, 2}) {
        cube.vertProperties.push_back(triPos[i][j]);
      }
      for (const int j : {0, 1, 2}) {
        cube.vertProperties.push_back(normal[j]);
      }
    }
  }

  cube.runOriginalID.push_back(Manifold::ReserveIDs(1));

  return cube;
}